

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

void __thiscall
TPZFMatrix<std::complex<float>_>::TPZFMatrix
          (TPZFMatrix<std::complex<float>_> *this,TPZVerySparseMatrix<std::complex<float>_> *A)

{
  complex<float> *__s;
  _Base_ptr p_Var1;
  ulong uVar2;
  _Self __tmp;
  
  TPZMatrix<std::complex<float>_>::TPZMatrix
            (&this->super_TPZMatrix<std::complex<float>_>,&PTR_PTR_01654270,
             (A->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow,
             (A->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol);
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01653fb8;
  this->fElem = (complex<float> *)0x0;
  this->fGiven = (complex<float> *)0x0;
  this->fSize = 0;
  TPZManVector<int,_5>::TPZManVector(&this->fPivot,0);
  (this->fWork)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01650620;
  (this->fWork).fStore = (complex<float> *)0x0;
  (this->fWork).fNElements = 0;
  (this->fWork).fNAlloc = 0;
  uVar2 = (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol *
          (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  if (uVar2 != 0) {
    __s = (complex<float> *)operator_new__(-(ulong)(uVar2 >> 0x3d != 0) | uVar2 * 8);
    this->fElem = __s;
    p_Var1 = (A->fExtraSparseData)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    memset(__s,0,uVar2 * 8);
    for (; (_Rb_tree_header *)p_Var1 != &(A->fExtraSparseData)._M_t._M_impl.super__Rb_tree_header;
        p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
      (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0x23])
                (this,*(undefined8 *)(p_Var1 + 1),p_Var1[1]._M_parent,&p_Var1[1]._M_left);
    }
  }
  return;
}

Assistant:

TPZFMatrix<TVar>::TPZFMatrix(TPZVerySparseMatrix <TVar> const & A)
: TPZRegisterClassId(&TPZFMatrix::ClassId),
TPZMatrix<TVar>( A.Rows(), A.Cols() ), fElem(0), fGiven(0), fSize(0) {
    
    int64_t size = this->fRow * this->fCol;
    if(!size) return;
    fElem = new TVar[ size ] ;
    
#ifdef PZDEBUG2
    if ( size && fElem == NULL ) Error( "Constructor <memory allocation error>." );
#endif
    
    typename std::map <std::pair<int64_t, int64_t>, TVar>::const_iterator it = A.MapBegin();
    typename std::map <std::pair<int64_t, int64_t>, TVar>::const_iterator end = A.MapEnd();
    
    TVar * p = fElem;
    memset((void *)p, 0, (size_t)size*sizeof(TVar));
    
    for (; it != end; it++) {
        const std::pair<int64_t, int64_t>& key = it->first;
        PutVal(key.first, key.second, it->second);
    }
    
}